

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_compress.c
# Opt level: O0

OPJ_PROG_ORDER give_progression(char *progression)

{
  int iVar1;
  char *progression_local;
  
  iVar1 = strncmp(progression,"LRCP",4);
  if (iVar1 == 0) {
    progression_local._4_4_ = OPJ_LRCP;
  }
  else {
    iVar1 = strncmp(progression,"RLCP",4);
    if (iVar1 == 0) {
      progression_local._4_4_ = OPJ_RLCP;
    }
    else {
      iVar1 = strncmp(progression,"RPCL",4);
      if (iVar1 == 0) {
        progression_local._4_4_ = OPJ_RPCL;
      }
      else {
        iVar1 = strncmp(progression,"PCRL",4);
        if (iVar1 == 0) {
          progression_local._4_4_ = OPJ_PCRL;
        }
        else {
          iVar1 = strncmp(progression,"CPRL",4);
          if (iVar1 == 0) {
            progression_local._4_4_ = OPJ_CPRL;
          }
          else {
            progression_local._4_4_ = OPJ_PROG_UNKNOWN;
          }
        }
      }
    }
  }
  return progression_local._4_4_;
}

Assistant:

static OPJ_PROG_ORDER give_progression(const char progression[4]) {
    if(strncmp(progression, "LRCP", 4) == 0) {
        return OPJ_LRCP;
    }
    if(strncmp(progression, "RLCP", 4) == 0) {
        return OPJ_RLCP;
    }
    if(strncmp(progression, "RPCL", 4) == 0) {
        return OPJ_RPCL;
    }
    if(strncmp(progression, "PCRL", 4) == 0) {
        return OPJ_PCRL;
    }
    if(strncmp(progression, "CPRL", 4) == 0) {
        return OPJ_CPRL;
    }

    return OPJ_PROG_UNKNOWN;
}